

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte in_00;
  bool bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  uchar in;
  dynbuf d;
  byte local_51;
  dynbuf local_50;
  
  if (inlength < 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    Curl_dyn_init(&local_50,24000000);
    if (inlength == 0) {
      sVar4 = strlen(string);
    }
    else {
      sVar4 = (size_t)(uint)inlength;
    }
    if (sVar4 == 0) {
      pcVar5 = (*Curl_cstrdup)("");
    }
    else {
      lVar6 = sVar4 + 1;
      pcVar5 = (char *)0x0;
      do {
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) {
          pcVar5 = Curl_dyn_ptr(&local_50);
          return pcVar5;
        }
        in_00 = *string;
        local_51 = in_00;
        _Var2 = Curl_isunreserved(in_00);
        if (_Var2) {
          CVar3 = Curl_dyn_addn(&local_50,&local_51,1);
          if (CVar3 == CURLE_OK) {
LAB_0012e6f0:
            string = (char *)((byte *)string + 1);
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
        else {
          bVar1 = false;
          CVar3 = Curl_dyn_addf(&local_50,"%%%02X",(ulong)in_00);
          if (CVar3 == CURLE_OK) goto LAB_0012e6f0;
        }
      } while (bVar1);
    }
  }
  return pcVar5;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  struct dynbuf d;
  (void)data;

  if(inlength < 0)
    return NULL;

  Curl_dyn_init(&d, CURL_MAX_INPUT_LENGTH * 3);

  length = (inlength?(size_t)inlength:strlen(string));
  if(!length)
    return strdup("");

  while(length--) {
    unsigned char in = *string; /* we need to treat the characters unsigned */

    if(Curl_isunreserved(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      if(Curl_dyn_addf(&d, "%%%02X", in))
        return NULL;
    }
    string++;
  }

  return Curl_dyn_ptr(&d);
}